

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  size_t __n;
  TestPartResultArray *this;
  char *__dest;
  TestPartResult *pTVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  char *pcVar4;
  AssertionResult *this_00;
  int index;
  size_t i;
  size_t sVar5;
  ostream *this_01;
  ostream *poVar6;
  undefined4 in_register_00000084;
  Type TVar7;
  long lVar8;
  AssertionResult AVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  String expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertionResult *local_58;
  AssertionResult local_50;
  String local_40;
  
  TVar7 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar4 = "1 non-fatal failure";
  if (TVar7 == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  lVar8 = (ulong)(TVar7 != kFatalFailure) * 4;
  __n = lVar8 + 0xf;
  local_58 = (AssertionResult *)param_1;
  __dest = (char *)operator_new__(lVar8 + 0x10);
  memcpy(__dest,pcVar4,__n);
  __dest[lVar8 + 0xf] = '\0';
  local_40.c_str_ = __dest;
  local_40.length_ = __n;
  Message::Message((Message *)&local_60);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == TVar7) {
      pcVar4 = strstr((pTVar1->message_).c_str_,(in_stack_00000008->_M_dataplus)._M_p);
      this_00 = local_58;
      if (pcVar4 != (char *)0x0) {
        local_58->success_ = true;
        (local_58->message_).ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar3.ptr_ = extraout_RDX;
        goto LAB_00113dcc;
      }
      local_50.success_ = false;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_50,(char (*) [11])0x12b610);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [14])" containing \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,in_stack_00000008);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x12be33);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
    else {
      local_50.success_ = false;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_50,(char (*) [11])0x12b610);
      this_00 = local_58;
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x12bd82);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
  }
  else {
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Expected: ",10);
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    sVar5 = 0;
    do {
      if (__dest[sVar5] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\0",2);
      }
      else {
        local_50.success_ = (bool)__dest[sVar5];
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_50.success_,1);
      }
      sVar5 = sVar5 + 1;
    } while (__n != sVar5);
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  Actual: ",10);
    this_01 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_01 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_01,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    poVar6 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar6 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar6 = (ostream *)(local_60.ptr_ + 0x10);
        if (local_60.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
        poVar6 = (ostream *)(local_60.ptr_ + 0x10);
        if (local_60.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar6 = (ostream *)0x0;
        }
        testing::operator<<(poVar6,pTVar1);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    local_50.success_ = false;
    local_50.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_50,(Message *)&local_60);
    this_00 = local_58;
    AssertionResult::AssertionResult(local_58,pAVar2);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX_00;
LAB_00113dcc:
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60.ptr_ + 8))();
    sVar3.ptr_ = extraout_RDX_01;
  }
  if (local_40.c_str_ != (char *)0x0) {
    operator_delete__(local_40.c_str_);
    sVar3.ptr_ = extraout_RDX_02;
  }
  AVar9.message_.ptr_ = sVar3.ptr_;
  AVar9._0_8_ = this_00;
  return AVar9;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}